

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O2

phits_file_t phits_open_file(char *filename)

{
  int iVar1;
  phits_fileinternal_t *f;
  FILE *__s;
  
  if (filename == (char *)0x0) {
    phits_error("phits_open_file called with null string for filename");
  }
  f = (phits_fileinternal_t *)calloc(1,0x110);
  if (f == (phits_fileinternal_t *)0x0) {
    phits_error("memory allocation failure");
  }
  f->reclen = 4;
  mcpl_generic_fopen(f,filename);
  iVar1 = phits_ensure_load(f,1);
  if (iVar1 == 0) {
    f->particlesize = 0;
    iVar1 = 0;
  }
  else {
    iVar1 = phits_tryload_reclen(f,4);
    if ((iVar1 == 0) && (iVar1 = phits_tryload_reclen(f,8), iVar1 == 0)) {
      if (7 < f->lbuf) {
        phits_error("Invalid PHITS dump file: Problems reading first record.\n");
      }
      phits_error("Invalid PHITS dump file: too short\n");
    }
    if (f->reclen == 8) {
      __s = (FILE *)phits_impl_stdout_data::thefh;
      if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
        __s = _stdout;
      }
      fwrite("phits_open_file WARNING: 64bit Fortran records detected which is untested (feedback appreciated at https://mctools.github.io/mcpl/contact/).\n"
             ,0x8d,1,__s);
    }
    iVar1 = 0;
    if ((f->particlesize != 0x50) && (iVar1 = 1, f->particlesize != 0x68)) {
      phits_error(
                 "Invalid PHITS dump file: Does not contain exactly 10 or 13 fields in each particle - like due to unsupported configuration flags being used when producing the file.\n"
                 );
    }
  }
  f->haspolarisation = iVar1;
  return (phits_file_t)f;
}

Assistant:

phits_file_t phits_open_file( const char * filename )
{
  if (!filename)
    phits_error("phits_open_file called with null string for filename");

  //Open, classify and process first record with mcnp type and version info:
  phits_file_t out = phits_open_internal( filename );
  phits_fileinternal_t * f = (phits_fileinternal_t *)out.internal;
  assert(f);

  out.internal = f;
  return out;
}